

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

optional<unsigned_int> convert_gram(IndexType type,int index,QString *string)

{
  pointer pQVar1;
  size_t sVar2;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  optional<unsigned_int> oVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t source;
  long lVar8;
  bool bVar9;
  
  sVar2 = get_ngram_size_for(type);
  if ((ulong)(((long)(string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                    super__Vector_impl_data._M_start) / 0x18) < (ulong)(long)((int)sVar2 + index)) {
LAB_00144275:
    uVar7 = 0;
    uVar6 = 0;
    uVar3 = 0;
  }
  else {
    lVar8 = (long)index * 0x18;
    source = 0;
    while (bVar9 = sVar2 != 0, sVar2 = sVar2 - 1, bVar9) {
      pQVar1 = (string->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pQVar1->opts_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar8 + 8) -
          *(long *)((long)&(pQVar1->opts_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar8) != 1) goto LAB_00144275;
      pvVar4 = QToken::possible_values
                         ((QToken *)
                          ((long)&(pQVar1->opts_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl + lVar8));
      source = source << 8 |
               (ulong)*(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x18;
    }
    oVar5 = convert_gram(type,source);
    uVar7 = (ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xffffff0000000000;
    uVar6 = (ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xff00000000;
    uVar3 = (ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0xffffffff;
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar7 | uVar6 | uVar3);
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, int index,
                                    const QString &string) {
    int size = get_ngram_size_for(type);
    if (index + size > string.size()) {
        return std::nullopt;
    }
    uint64_t source = 0;
    for (int i = 0; i < size; i++) {
        if (!string[index + i].unique()) {
            return std::nullopt;
        }
        source = (source << 8) | string[index + i].possible_values()[0];
    }
    return convert_gram(type, source);
}